

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBar::ToolBar(ToolBar *this,QWidget *parent)

{
  NavigationArrow *pNVar1;
  ToolBarPrivate *this_00;
  undefined4 *puVar2;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  QObject local_38 [8];
  QObject local_30 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_001940e8;
  *(undefined ***)&this->field_0x10 = &PTR__ToolBar_00194298;
  this_00 = (ToolBarPrivate *)operator_new(0x28);
  this_00->q = this;
  (this_00->iconSize).wd = -1;
  (this_00->iconSize).ht = -1;
  this_00->layout = (ToolBarLayout *)0x0;
  this_00->left = (NavigationArrow *)0x0;
  this_00->right = (NavigationArrow *)0x0;
  (this->d).d = this_00;
  ToolBarPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  pNVar1 = ((this->d).d)->left;
  local_48 = NavigationArrow::clicked;
  local_40 = 0;
  local_58 = _q_leftArrowClicked;
  local_50 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::ToolBar::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = _q_leftArrowClicked;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_30,(void **)pNVar1,(QObject *)&local_48,(void **)this,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  pNVar1 = ((this->d).d)->right;
  local_48 = NavigationArrow::clicked;
  local_40 = 0;
  local_58 = _q_rightArrowClicked;
  local_50 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::ToolBar::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = _q_rightArrowClicked;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pNVar1,(QObject *)&local_48,(void **)this,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

ToolBar::ToolBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new ToolBarPrivate( this ) )
{
	d->init();

	connect( d->left, &NavigationArrow::clicked,
		this, &ToolBar::_q_leftArrowClicked );

	connect( d->right, &NavigationArrow::clicked,
		this, &ToolBar::_q_rightArrowClicked );
}